

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O3

void __thiscall
Assimp::MDLImporter::ValidateHeader_3DGS_MDL7(MDLImporter *this,Header_MDL7 *pcHeader)

{
  runtime_error *prVar1;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (pcHeader == (Header_MDL7 *)0x0) {
    __assert_fail("__null != pcHeader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MDL/MDLLoader.cpp"
                  ,0x374,
                  "void Assimp::MDLImporter::ValidateHeader_3DGS_MDL7(const MDL::Header_MDL7 *)");
  }
  if (pcHeader->colorvalue_stc_size != 0x10) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,
               "[3DGS MDL7] sizeof(MDL::ColorValue_MDL7) != pcHeader->colorvalue_stc_size","");
    std::runtime_error::runtime_error(prVar1,(string *)local_40);
    *(undefined ***)prVar1 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar1,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (pcHeader->skinpoint_stc_size != 8) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,
               "[3DGS MDL7] sizeof(MDL::TexCoord_MDL7) != pcHeader->skinpoint_stc_size","");
    std::runtime_error::runtime_error(prVar1,(string *)local_40);
    *(undefined ***)prVar1 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar1,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (pcHeader->skin_stc_size == 0x1c) {
    if (pcHeader->groups_num != 0) {
      return;
    }
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"[3DGS MDL7] No frames found","");
    std::runtime_error::runtime_error(prVar1,(string *)local_40);
    *(undefined ***)prVar1 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar1,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"sizeof(MDL::Skin_MDL7) != pcHeader->skin_stc_size","");
  std::runtime_error::runtime_error(prVar1,(string *)local_40);
  *(undefined ***)prVar1 = &PTR__runtime_error_0080bf48;
  __cxa_throw(prVar1,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MDLImporter::ValidateHeader_3DGS_MDL7(const MDL::Header_MDL7* pcHeader)
{
    ai_assert(NULL != pcHeader);

    // There are some fixed sizes ...
    if (sizeof(MDL::ColorValue_MDL7) != pcHeader->colorvalue_stc_size)  {
        throw DeadlyImportError(
            "[3DGS MDL7] sizeof(MDL::ColorValue_MDL7) != pcHeader->colorvalue_stc_size");
    }
    if (sizeof(MDL::TexCoord_MDL7) != pcHeader->skinpoint_stc_size) {
        throw DeadlyImportError(
            "[3DGS MDL7] sizeof(MDL::TexCoord_MDL7) != pcHeader->skinpoint_stc_size");
    }
    if (sizeof(MDL::Skin_MDL7) != pcHeader->skin_stc_size)  {
        throw DeadlyImportError(
            "sizeof(MDL::Skin_MDL7) != pcHeader->skin_stc_size");
    }

    // if there are no groups ... how should we load such a file?
    if(!pcHeader->groups_num)   {
        throw DeadlyImportError( "[3DGS MDL7] No frames found");
    }
}